

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismaticJoint.cpp
# Opt level: O0

TransformDerivative * __thiscall
iDynTree::PrismaticJoint::getTransformDerivative
          (PrismaticJoint *this,VectorDynSize *jntPos,LinkIndex linkA,LinkIndex linkB,int posCoord_i
          )

{
  ulong uVar1;
  long in_RCX;
  VectorDynSize *in_RDX;
  long *in_RSI;
  PrismaticJoint *in_RDI;
  TransformDerivative link1_dX_link2;
  double dist;
  TransformDerivative *linkA_dX_linkB;
  PrismaticJoint *this_00;
  TransformDerivative local_f8;
  TransformDerivative local_98;
  double local_38;
  long local_20;
  
  this_00 = in_RDI;
  local_20 = in_RCX;
  uVar1 = (**(code **)(*in_RSI + 0xb0))();
  local_38 = (double)iDynTree::VectorDynSize::operator()(in_RDX,uVar1);
  iDynTree::Axis::getTranslationTransformDerivative(local_38);
  iDynTree::TransformDerivative::operator*(&local_98,(Transform *)&local_f8);
  TransformDerivative::~TransformDerivative(&local_f8);
  if (local_20 == in_RSI[4]) {
    iDynTree::TransformDerivative::TransformDerivative((TransformDerivative *)in_RDI,&local_98);
  }
  else {
    updateBuffers(this_00,(double)in_RDI);
    iDynTree::TransformDerivative::derivativeOfInverse((Transform *)in_RDI);
  }
  TransformDerivative::~TransformDerivative(&local_98);
  return (TransformDerivative *)this_00;
}

Assistant:

TransformDerivative PrismaticJoint::getTransformDerivative(const VectorDynSize& jntPos,
                                                          const LinkIndex linkA,
                                                          const LinkIndex linkB,
                                                          const int posCoord_i) const
{
    const double dist = jntPos(this->getPosCoordsOffset());

    TransformDerivative link1_dX_link2 = translation_axis_wrt_link1.getTranslationTransformDerivative(dist)*link1_X_link2_at_rest;

    if( linkA == this->link1 )
    {
        return link1_dX_link2;
    }
    else
    {
        updateBuffers(dist);
        TransformDerivative linkA_dX_linkB = link1_dX_link2.derivativeOfInverse(this->link1_X_link2);
        return linkA_dX_linkB;
    }
}